

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::Scale(FormattingScene *this,Float sx,Float sy,Float sz,FileLoc loc)

{
  Float local_54;
  Float local_50;
  Float local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_54 = sz;
  local_50 = sy;
  local_4c = sx;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_48,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,float&,float&,float&>
            ("%sScale %f %f %f\n",&local_48,&local_4c,&local_50,&local_54);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::Scale(Float sx, Float sy, Float sz, FileLoc loc) {
    Printf("%sScale %f %f %f\n", indent(), sx, sy, sz);
}